

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_ls.c
# Opt level: O0

int kinLsPSetup(void *kinmem)

{
  KINLsMem pKStack_28;
  int retval;
  KINLsMem kinls_mem;
  KINMem kin_mem;
  void *kinmem_local;
  
  kin_mem = (KINMem)kinmem;
  kinmem_local._4_4_ =
       kinLs_AccessLMem(kinmem,"kinLsPSetup",(KINMem *)&kinls_mem,&stack0xffffffffffffffd8);
  if (kinmem_local._4_4_ == 0) {
    kinmem_local._4_4_ =
         (*pKStack_28->pset)((N_Vector)kinls_mem[1].nps,(N_Vector)kinls_mem[1].last_flag,
                             (N_Vector)kinls_mem[1].njtimes,(N_Vector)kinls_mem[1].pset,
                             pKStack_28->pdata);
    pKStack_28->npe = pKStack_28->npe + 1;
  }
  return kinmem_local._4_4_;
}

Assistant:

int kinLsPSetup(void *kinmem)
{
  KINMem   kin_mem;
  KINLsMem kinls_mem;
  int      retval;

  /* access KINLsMem structure */
  retval = kinLs_AccessLMem(kinmem, "kinLsPSetup",
                            &kin_mem, &kinls_mem);
  if (retval != KIN_SUCCESS)  return(retval);

  /* Call user pset routine to update preconditioner */
  retval = kinls_mem->pset(kin_mem->kin_uu, kin_mem->kin_uscale,
                           kin_mem->kin_fval, kin_mem->kin_fscale,
                           kinls_mem->pdata);
  kinls_mem->npe++;
  return(retval);
}